

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_update_extensions.cpp
# Opt level: O2

SourceResultType __thiscall
duckdb::PhysicalUpdateExtensions::GetData
          (PhysicalUpdateExtensions *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  GlobalSourceState *pGVar1;
  ulong uVar2;
  reference pvVar3;
  long lVar4;
  ulong __n;
  _func_int **pp_Var5;
  ulong index;
  bool bVar6;
  string local_110;
  string local_f0;
  string local_d0;
  Value local_b0;
  string local_70;
  string local_50;
  
  pGVar1 = input->global_state;
  __n = *(ulong *)((long)&pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex +
                  8);
  pp_Var5 = pGVar1[1]._vptr_GlobalSourceState;
  lVar4 = *(long *)&pGVar1[1].super_StateWithBlockableTasks;
  bVar6 = true;
  if (__n < (ulong)((lVar4 - (long)pp_Var5) / 0xa8)) {
    for (index = 0; (uVar2 = (lVar4 - (long)pp_Var5) / 0xa8, __n < uVar2 && (index < 0x800));
        index = index + 1) {
      pvVar3 = vector<duckdb::ExtensionUpdateResult,_true>::get<true>
                         ((vector<duckdb::ExtensionUpdateResult,_true> *)(pGVar1 + 1),__n);
      ::std::__cxx11::string::string((string *)&local_d0,(string *)&pvVar3->extension_name);
      Value::Value(&local_b0,&local_d0);
      DataChunk::SetValue(chunk,0,index,&local_b0);
      Value::~Value(&local_b0);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::__cxx11::string::string((string *)&local_f0,(string *)&pvVar3->repository);
      Value::Value(&local_b0,&local_f0);
      DataChunk::SetValue(chunk,1,index,&local_b0);
      Value::~Value(&local_b0);
      ::std::__cxx11::string::~string((string *)&local_f0);
      EnumUtil::ToString<duckdb::ExtensionUpdateResultTag>(&local_110,pvVar3->tag);
      Value::Value(&local_b0,&local_110);
      DataChunk::SetValue(chunk,2,index,&local_b0);
      Value::~Value(&local_b0);
      ::std::__cxx11::string::~string((string *)&local_110);
      ::std::__cxx11::string::string((string *)&local_50,(string *)&pvVar3->prev_version);
      Value::Value(&local_b0,&local_50);
      DataChunk::SetValue(chunk,3,index,&local_b0);
      Value::~Value(&local_b0);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::string((string *)&local_70,(string *)&pvVar3->installed_version);
      Value::Value(&local_b0,&local_70);
      DataChunk::SetValue(chunk,4,index,&local_b0);
      Value::~Value(&local_b0);
      ::std::__cxx11::string::~string((string *)&local_70);
      __n = *(long *)((long)&pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base.
                             _M_mutex + 8) + 1;
      *(ulong *)((long)&pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex + 8
                ) = __n;
      pp_Var5 = pGVar1[1]._vptr_GlobalSourceState;
      lVar4 = *(long *)&pGVar1[1].super_StateWithBlockableTasks;
    }
    chunk->count = index;
    bVar6 = uVar2 <= __n;
  }
  return bVar6;
}

Assistant:

SourceResultType PhysicalUpdateExtensions::GetData(ExecutionContext &context, DataChunk &chunk,
                                                   OperatorSourceInput &input) const {
	auto &data = input.global_state.Cast<UpdateExtensionsGlobalState>();

	if (data.offset >= data.update_result_entries.size()) {
		// finished returning values
		return SourceResultType::FINISHED;
	}

	idx_t count = 0;
	while (data.offset < data.update_result_entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.update_result_entries[data.offset];

		// return values:
		idx_t col = 0;
		// extension_name LogicalType::VARCHAR
		chunk.SetValue(col++, count, Value(entry.extension_name));
		// repository LogicalType::VARCHAR
		chunk.SetValue(col++, count, Value(entry.repository));
		// update_result
		chunk.SetValue(col++, count, Value(EnumUtil::ToString(entry.tag)));
		// previous_version LogicalType::VARCHAR
		chunk.SetValue(col++, count, Value(entry.prev_version));
		// current_version LogicalType::VARCHAR
		chunk.SetValue(col++, count, Value(entry.installed_version));

		data.offset++;
		count++;
	}
	chunk.SetCardinality(count);

	return data.offset >= data.update_result_entries.size() ? SourceResultType::FINISHED
	                                                        : SourceResultType::HAVE_MORE_OUTPUT;
}